

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_select
                (run_container_t *container,uint32_t *start_rank,uint32_t rank,uint32_t *element)

{
  uint32_t uVar1;
  rle16_t *prVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  
  bVar3 = 0 < container->n_runs;
  if (0 < container->n_runs) {
    prVar2 = container->runs;
    lVar5 = 0;
    do {
      uVar4 = (uint)prVar2[lVar5].length;
      uVar1 = *start_rank;
      if (rank <= uVar1 + uVar4) {
        *element = (rank - uVar1) + (uint)prVar2[lVar5].value;
        return bVar3;
      }
      *start_rank = uVar1 + uVar4 + 1;
      lVar5 = lVar5 + 1;
      bVar3 = lVar5 < container->n_runs;
    } while (lVar5 < container->n_runs);
  }
  return bVar3;
}

Assistant:

bool run_container_select(const run_container_t *container,
                          uint32_t *start_rank, uint32_t rank,
                          uint32_t *element) {
    for (int i = 0; i < container->n_runs; i++) {
        uint16_t length = container->runs[i].length;
        if (rank <= *start_rank + length) {
            uint16_t value = container->runs[i].value;
            *element = value + rank - (*start_rank);
            return true;
        } else
            *start_rank += length + 1;
    }
    return false;
}